

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O2

void updateParameters(Quadratic *idata,ICrashOptions *options,int iteration)

{
  uint uVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_31;
  vector<double,_std::allocator<double>_> residual;
  value_type_conflict1 local_18;
  
  if (iteration == 1) {
    return;
  }
  switch(options->strategy) {
  case kPenalty:
    break;
  case kAdmm:
    highsLogUser(&options->log_options,kInfo,
                 "ICrashError: ADMM parameter update not implemented yet.");
    return;
  case kICA:
    if (iteration % 3 != 0) {
      local_18 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&residual,(long)(idata->lp).num_row_,&local_18,&local_31);
      updateResidualIca(&idata->lp,&idata->xk,&residual);
      uVar1 = (idata->lp).num_row_;
      pdVar2 = (idata->lambda).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pdVar2[uVar4] =
             idata->mu *
             residual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
      }
LAB_0031dc4f:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&residual.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    break;
  case kUpdatePenalty:
    if (iteration % 3 != 0) {
      return;
    }
    break;
  case kUpdateAdmm:
    if (iteration % 3 != 0) {
      calculateRowValuesQuad(&idata->lp,&idata->xk,-1);
      local_18 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&residual,(long)(idata->lp).num_row_,&local_18,&local_31);
      updateResidualFast(&idata->lp,&idata->xk,&residual);
      uVar1 = (idata->lp).num_row_;
      pdVar2 = (idata->lambda).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pdVar2[uVar4] =
             idata->mu *
             residual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4] + pdVar2[uVar4];
      }
      goto LAB_0031dc4f;
    }
    break;
  default:
    goto switchD_0031db32_default;
  }
  idata->mu = idata->mu * 0.1;
switchD_0031db32_default:
  return;
}

Assistant:

void updateParameters(Quadratic& idata, const ICrashOptions& options,
                      const int iteration) {
  if (iteration == 1) return;

  // The other strategies are WIP.
  switch (options.strategy) {
    case ICrashStrategy::kPenalty: {
      idata.mu = 0.1 * idata.mu;
      break;
    }
    case ICrashStrategy::kAdmm: {
      // std::cout << "ICrash Error: ADMM parameter update not implemented." <<
      // std::endl;
      highsLogUser(options.log_options, HighsLogType::kInfo,
                   "ICrashError: ADMM parameter update not implemented yet.");
      break;
    }
    case ICrashStrategy::kICA: {
      // Update mu every third iteration, otherwise update lambda.
      if (iteration % 3 == 0) {
        idata.mu = 0.1 * idata.mu;
      } else {
        std::vector<double> residual_ica(idata.lp.num_row_, 0);
        updateResidualIca(idata.lp, idata.xk, residual_ica);
        for (int row = 0; row < idata.lp.num_row_; row++)
          idata.lambda[row] = idata.mu * residual_ica[row];
      }
      break;
    }
    case ICrashStrategy::kUpdatePenalty: {
      // Update mu every third iteration, otherwise do nothing.
      if (iteration % 3 == 0) idata.mu = 0.1 * idata.mu;
      break;
    }
    case ICrashStrategy::kUpdateAdmm: {
      // Update mu every third iteration, otherwise update lambda.
      if (iteration % 3 == 0) {
        idata.mu = 0.1 * idata.mu;
      } else {
        calculateRowValuesQuad(idata.lp, idata.xk);
        std::vector<double> residual(idata.lp.num_row_, 0);
        updateResidualFast(idata.lp, idata.xk, residual);
        for (int row = 0; row < idata.lp.num_row_; row++)
          // todo: double check clp.
          idata.lambda[row] = idata.lambda[row] + idata.mu * residual[row];
      }
      break;
    }
  }
}